

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

int __thiscall
QMetaObjectBuilder::indexOfConstructor(QMetaObjectBuilder *this,QByteArray *signature)

{
  pointer pQVar1;
  pointer pQVar2;
  qsizetype __n;
  int iVar3;
  pointer pQVar4;
  ulong uVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  pcVar6 = (signature->d).ptr;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = "";
  }
  QMetaObject::normalizedSignature(&local_58,pcVar6);
  __n = local_58.d.size;
  pcVar6 = local_58.d.ptr;
  pQVar1 = (this->d->constructors).
           super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pQVar2 = (this->d->constructors).
           super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = -1;
  if (pQVar1 != pQVar2) {
    uVar5 = 0;
    do {
      bVar7 = (undefined1 *)__n == *(undefined1 **)((long)&(pQVar1->signature).d.size + uVar5);
      if (bVar7 && (undefined1 *)__n != (undefined1 *)0x0) {
        iVar3 = bcmp(pcVar6,*(void **)((long)&(pQVar1->signature).d.ptr + uVar5),__n);
        bVar7 = iVar3 == 0;
      }
      if (bVar7) {
        iVar3 = (int)(uVar5 >> 3) * -0x3b13b13b;
        goto LAB_0028dad6;
      }
      pQVar4 = (pointer)((long)&pQVar1[1].signature.d.d + uVar5);
      uVar5 = uVar5 + 0x68;
    } while (pQVar4 != pQVar2);
    iVar3 = -1;
  }
LAB_0028dad6:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int QMetaObjectBuilder::indexOfConstructor(const QByteArray &signature)
{
    QByteArray sig = QMetaObject::normalizedSignature(signature);
    for (const auto &constructor : d->constructors) {
        if (sig == constructor.signature)
            return int(&constructor - &d->constructors.front());
    }
    return -1;
}